

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddLine(ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImU32 col,float thickness)

{
  ImVec2 local_30;
  
  if (0xffffff < col) {
    local_30.x = (*p1).x + 0.5;
    local_30.y = (*p1).y + 0.5;
    ImVector<ImVec2>::push_back(&this->_Path,&local_30);
    local_30.x = (*p2).x + 0.5;
    local_30.y = (*p2).y + 0.5;
    ImVector<ImVec2>::push_back(&this->_Path,&local_30);
    PathStroke(this,col,0,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& p1, const ImVec2& p2, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(p1 + ImVec2(0.5f, 0.5f));
    PathLineTo(p2 + ImVec2(0.5f, 0.5f));
    PathStroke(col, 0, thickness);
}